

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O3

bool __thiscall QTabBar::event(QTabBar *this,QEvent *event)

{
  undefined1 *rect;
  ushort uVar1;
  QTabBarPrivate *this_00;
  long lVar2;
  Tab *pTVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  uint index;
  QStyle *pQVar7;
  QPoint QVar8;
  QPoint QVar9;
  long lVar10;
  long in_FS_OFFSET;
  double dVar11;
  QRect QVar12;
  undefined1 auVar13 [16];
  QRect local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTabBarPrivate **)&(this->super_QWidget).field_0x8;
  uVar1 = *(ushort *)(event + 8);
  if (uVar1 < 0x6e) {
    if (uVar1 < 0x3c) {
      if ((uVar1 - 2 < 2) || (uVar1 == 5)) {
        auVar13 = QEventPoint::position();
        dVar11 = (double)((ulong)auVar13._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar13._0_8_;
        bVar5 = 2147483647.0 < dVar11;
        if (dVar11 <= -2147483648.0) {
          dVar11 = -2147483648.0;
        }
        QVar9.xp.m_i = (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 |
                                    ~-(ulong)bVar5 & (ulong)dVar11);
        dVar11 = (double)((ulong)auVar13._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar13._8_8_;
        bVar5 = 2147483647.0 < dVar11;
        if (dVar11 <= -2147483648.0) {
          dVar11 = -2147483648.0;
        }
        QVar9.yp.m_i = (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 |
                                    ~-(ulong)bVar5 & (ulong)dVar11);
        this_00->mousePosition = QVar9;
        (this_00->mouseButtons).super_QFlagsStorageHelper<Qt::MouseButton,_4>.
        super_QFlagsStorage<Qt::MouseButton>.i = *(Int *)(event + 0x44);
      }
    }
    else if (uVar1 - 0x3e < 2) {
      QBasicTimer::stop();
      this_00->switchTabCurrentIndex = -1;
LAB_0048d212:
      event[0xc] = (QEvent)0x0;
    }
    else if (uVar1 == 0x3c) {
      if ((this_00->field_0x2d1 & 0x10) != 0) {
        event[0xc] = (QEvent)0x1;
      }
    }
    else if ((uVar1 == 0x3d) && ((this_00->field_0x2d1 & 0x10) != 0)) {
      dVar11 = (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000)
               + *(double *)(event + 0x10);
      bVar5 = 2147483647.0 < dVar11;
      if (dVar11 <= -2147483648.0) {
        dVar11 = -2147483648.0;
      }
      local_48.x1.m_i =
           (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar11);
      dVar11 = (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000)
               + *(double *)(event + 0x18);
      bVar5 = 2147483647.0 < dVar11;
      if (dVar11 <= -2147483648.0) {
        dVar11 = -2147483648.0;
      }
      local_48.y1.m_i =
           (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar11);
      iVar6 = tabAt(this,(QPoint *)&local_48);
      lVar2 = *(long *)&(this->super_QWidget).field_0x8;
      if (((((ulong)(long)iVar6 < *(ulong *)(lVar2 + 0x2e8)) &&
           (lVar2 = *(long *)(*(long *)(lVar2 + 0x2e0) + (long)iVar6 * 8), lVar2 != 0)) &&
          ((*(byte *)(lVar2 + 0xe4) & 1) != 0)) && (this_00->switchTabCurrentIndex != iVar6)) {
        this_00->switchTabCurrentIndex = iVar6;
        pQVar7 = QWidget::style(&this->super_QWidget);
        iVar6 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x68,0,this,0);
        QBasicTimer::start(&this_00->switchTabTimer,(long)iVar6 * 1000000,1,this);
      }
      goto LAB_0048d212;
    }
  }
  else {
    if (0x7a < uVar1) {
      switch(uVar1) {
      case 0x7b:
        iVar6 = QTabBarPrivate::indexAtPos(this_00,(QPoint *)(event + 0x10));
        if ((((ulong)(long)iVar6 < (ulong)(this_00->tabList).d.size) &&
            (pTVar3 = (this_00->tabList).d.ptr[iVar6], pTVar3 != (Tab *)0x0)) &&
           (bVar5 = true, (pTVar3->whatsThis).d.size != 0)) goto LAB_0048d224;
        event[0xc] = (QEvent)0x0;
        break;
      default:
        goto switchD_0048cfc4_caseD_7c;
      case 0x7f:
      case 0x81:
        auVar13 = QEventPoint::position();
        dVar11 = (double)((ulong)auVar13._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar13._0_8_;
        bVar5 = 2147483647.0 < dVar11;
        if (dVar11 <= -2147483648.0) {
          dVar11 = -2147483648.0;
        }
        QVar8.xp.m_i = (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 |
                                    ~-(ulong)bVar5 & (ulong)dVar11);
        dVar11 = (double)((ulong)auVar13._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar13._8_8_;
        bVar5 = 2147483647.0 < dVar11;
        if (dVar11 <= -2147483648.0) {
          dVar11 = -2147483648.0;
        }
        QVar8.yp.m_i = (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 |
                                    ~-(ulong)bVar5 & (ulong)dVar11);
        this_00->mousePosition = QVar8;
        rect = &(this_00->super_QWidgetPrivate).field_0x254;
        cVar4 = QRect::contains((QPoint *)rect,SUB81(&this_00->mousePosition,0));
        bVar5 = true;
        if (cVar4 == '\0') {
          if ((*(int *)&(this_00->super_QWidgetPrivate).field_0x254 <= *(int *)&this_00->field_0x25c
              ) && (*(int *)&this_00->field_0x258 <= *(int *)&this_00->field_0x260)) {
            QWidget::update(&this->super_QWidget,(QRect *)rect);
          }
          index = tabAt(this,&this_00->mousePosition);
          this_00->hoverIndex = index;
          if (((int)index < 0) || ((ulong)(this_00->tabList).d.size <= (ulong)index)) {
            *(undefined8 *)rect = 0;
            *(undefined8 *)&this_00->field_0x25c = 0xffffffffffffffff;
          }
          else {
            QVar12 = tabRect(this,index);
            *(QRect *)&(this_00->super_QWidgetPrivate).field_0x254 = QVar12;
            QWidget::update(&this->super_QWidget,(QRect *)rect);
          }
        }
        goto LAB_0048d224;
      case 0x80:
        (this_00->mousePosition).xp = -1;
        (this_00->mousePosition).yp = -1;
        if ((*(int *)&(this_00->super_QWidgetPrivate).field_0x254 <= *(int *)&this_00->field_0x25c)
           && (*(int *)&this_00->field_0x258 <= *(int *)&this_00->field_0x260)) {
          QWidget::update(&this->super_QWidget,(QRect *)&(this_00->super_QWidgetPrivate).field_0x254
                         );
        }
        this_00->hoverIndex = -1;
        *(undefined8 *)&(this_00->super_QWidgetPrivate).field_0x254 = 0;
        *(undefined8 *)&this_00->field_0x25c = 0xffffffffffffffff;
        (this_00->accumulatedAngleDelta).xp = 0;
        (this_00->accumulatedAngleDelta).yp = 0;
      }
LAB_0048d3d1:
      bVar5 = true;
      goto LAB_0048d224;
    }
    if (uVar1 == 0x6e) {
      iVar6 = tabAt(this,(QPoint *)(event + 0x10));
      if ((((ulong)(long)iVar6 < (ulong)(this_00->tabList).d.size) &&
          (pTVar3 = (this_00->tabList).d.ptr[iVar6], pTVar3 != (Tab *)0x0)) &&
         ((pTVar3->toolTip).d.size != 0)) {
        local_48.x1.m_i = 0;
        local_48.y1.m_i = 0;
        local_48.x2.m_i = -1;
        local_48.y2.m_i = -1;
        QToolTip::showText((QPoint *)(event + 0x18),&pTVar3->toolTip,&this->super_QWidget,&local_48,
                           -1);
        goto LAB_0048d3d1;
      }
    }
    else if (uVar1 == 0x6f) {
      iVar6 = QTabBarPrivate::indexAtPos(this_00,(QPoint *)(event + 0x10));
      if ((((ulong)(long)iVar6 < (ulong)(this_00->tabList).d.size) &&
          (pTVar3 = (this_00->tabList).d.ptr[iVar6], pTVar3 != (Tab *)0x0)) &&
         ((pTVar3->whatsThis).d.size != 0)) {
        QWhatsThis::showText((QPoint *)(event + 0x18),&pTVar3->whatsThis,&this->super_QWidget);
        goto LAB_0048d3d1;
      }
    }
    else if ((uVar1 == 0x75) && (lVar2 = (this_00->tabList).d.size, lVar2 != 0)) {
      lVar10 = 0;
      do {
        if ((this_00->tabList).d.ptr[lVar10]->shortcutId == *(int *)(event + 0x18)) {
          setCurrentIndex(this,(int)lVar10);
          goto LAB_0048d3d1;
        }
        lVar10 = lVar10 + 1;
      } while (lVar2 != lVar10);
    }
  }
switchD_0048cfc4_caseD_7c:
  bVar5 = QWidget::event(&this->super_QWidget,event);
LAB_0048d224:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QTabBar::event(QEvent *event)
{
    Q_D(QTabBar);
    switch (event->type()) {
    case QEvent::HoverMove:
    case QEvent::HoverEnter: {
        QHoverEvent *he = static_cast<QHoverEvent *>(event);
        d->mousePosition = he->position().toPoint();
        if (!d->hoverRect.contains(d->mousePosition)) {
            if (d->hoverRect.isValid())
                update(d->hoverRect);
            d->hoverIndex = tabAt(d->mousePosition);
            if (d->validIndex(d->hoverIndex)) {
                d->hoverRect = tabRect(d->hoverIndex);
                update(d->hoverRect);
            } else {
                d->hoverRect = QRect();
            }
        }
        return true;
    }
    case QEvent::HoverLeave: {
        d->mousePosition = {-1, -1};
        if (d->hoverRect.isValid())
            update(d->hoverRect);
        d->hoverIndex = -1;
        d->hoverRect = QRect();
#if QT_CONFIG(wheelevent)
        d->accumulatedAngleDelta = QPoint();
#endif
        return true;
    }
#if QT_CONFIG(tooltip)
    case QEvent::ToolTip:
        if (const QTabBarPrivate::Tab *tab = d->at(tabAt(static_cast<QHelpEvent*>(event)->pos()))) {
            if (!tab->toolTip.isEmpty()) {
                QToolTip::showText(static_cast<QHelpEvent*>(event)->globalPos(), tab->toolTip, this);
                return true;
            }
        }
        break;
#endif // QT_CONFIG(tooltip)
#if QT_CONFIG(whatsthis)
    case QEvent::QEvent::QueryWhatsThis: {
        const QTabBarPrivate::Tab *tab = d->at(d->indexAtPos(static_cast<QHelpEvent*>(event)->pos()));
        if (!tab || tab->whatsThis.isEmpty())
            event->ignore();
        return true;
    }
    case QEvent::WhatsThis:
        if (const QTabBarPrivate::Tab *tab = d->at(d->indexAtPos(static_cast<QHelpEvent*>(event)->pos()))) {
            if (!tab->whatsThis.isEmpty()) {
                QWhatsThis::showText(static_cast<QHelpEvent*>(event)->globalPos(),
                                     tab->whatsThis, this);
                return true;
            }
        }
        break;
#endif // QT_CONFIG(whatsthis)
#ifndef QT_NO_SHORTCUT

    case QEvent::Shortcut: {
        QShortcutEvent *se = static_cast<QShortcutEvent *>(event);
        for (int i = 0; i < d->tabList.size(); ++i) {
            const QTabBarPrivate::Tab *tab = d->tabList.at(i);
            if (tab->shortcutId == se->shortcutId()) {
                setCurrentIndex(i);
                return true;
            }
        }
    }
        break;
#endif
    case QEvent::Move:
        d->updateMacBorderMetrics();
        break;
#if QT_CONFIG(draganddrop)

    case QEvent::DragEnter:
        if (d->changeCurrentOnDrag)
            event->accept();
        break;
    case QEvent::DragMove:
        if (d->changeCurrentOnDrag) {
            const int tabIndex = tabAt(static_cast<QDragMoveEvent *>(event)->position().toPoint());
            if (isTabEnabled(tabIndex) && d->switchTabCurrentIndex != tabIndex) {
                d->switchTabCurrentIndex = tabIndex;
                d->switchTabTimer.start(
                    style()->styleHint(QStyle::SH_TabBar_ChangeCurrentDelay, nullptr, this) * 1ms, this);
            }
            event->ignore();
        }
        break;
    case QEvent::DragLeave:
    case QEvent::Drop:
        d->killSwitchTabTimer();
        event->ignore();
        break;
#endif
    case QEvent::MouseButtonPress:
    case QEvent::MouseButtonRelease:
    case QEvent::MouseMove:
        d->mousePosition = static_cast<QMouseEvent *>(event)->position().toPoint();
        d->mouseButtons = static_cast<QMouseEvent *>(event)->buttons();
        break;
    default:
        break;
    }

    return QWidget::event(event);
}